

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

int cm_zlib_gzputs(gzFile file,char *s)

{
  size_t len_00;
  z_size_t zVar1;
  int local_3c;
  gz_statep state;
  z_size_t put;
  z_size_t len;
  char *s_local;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local._4_4_ = -1;
  }
  else if ((file[1].have == 0x79b1) && (*(int *)((long)&file[4].pos + 4) == 0)) {
    len_00 = strlen(s);
    local_3c = (int)len_00;
    if ((local_3c < 0) || ((len_00 & 0xffffffff) != len_00)) {
      cm_zlib_gz_error((gz_statep)file,-2,"string length does not fit in int");
      file_local._4_4_ = -1;
    }
    else {
      zVar1 = gz_write((gz_statep)file,s,len_00);
      if (zVar1 < len_00) {
        local_3c = -1;
      }
      file_local._4_4_ = local_3c;
    }
  }
  else {
    file_local._4_4_ = -1;
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzputs(gzFile file, const char *s) {
    z_size_t len, put;
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return -1;

    /* write string */
    len = strlen(s);
    if ((int)len < 0 || (unsigned)len != len) {
        gz_error(state, Z_STREAM_ERROR, "string length does not fit in int");
        return -1;
    }
    put = gz_write(state, s, len);
    return put < len ? -1 : (int)len;
}